

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O3

void __thiscall FluidSynthMIDIDevice::~FluidSynthMIDIDevice(FluidSynthMIDIDevice *this)

{
  char *__function;
  
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__FluidSynthMIDIDevice_006f0d90;
  SoftSynthMIDIDevice::Close(&this->super_SoftSynthMIDIDevice);
  if (this->FluidSynth != (fluid_synth_t *)0x0) {
    if (FluidSynthModule.handle == (void *)0x0) {
      __function = 
      "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *)>::operator int (*)(fluid_synth_t *)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *)]"
      ;
      goto LAB_00340b3a;
    }
    (*(code *)delete_fluid_synth.proc.Call)();
  }
  if (this->FluidSettings != (fluid_settings_t *)0x0) {
    if (FluidSynthModule.handle == (void *)0x0) {
      __function = 
      "Proto TReqProc<FluidSynthModule, void (*)(fluid_settings_t *)>::operator void (*)(fluid_settings_t *)() const [Module = FluidSynthModule, Proto = void (*)(fluid_settings_t *)]"
      ;
LAB_00340b3a:
      __assert_fail("Module.IsLoaded()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                    ,0xd2,__function);
    }
    (*(code *)delete_fluid_settings.proc.Call)();
  }
  FModule::Unload(&FluidSynthModule);
  SoftSynthMIDIDevice::~SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  return;
}

Assistant:

FluidSynthMIDIDevice::~FluidSynthMIDIDevice()
{
	Close();
	if (FluidSynth != NULL)
	{
		delete_fluid_synth(FluidSynth);
	}
	if (FluidSettings != NULL)
	{
		delete_fluid_settings(FluidSettings);
	}
#ifdef DYN_FLUIDSYNTH
	UnloadFluidSynth();
#endif
}